

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O2

void __thiscall
PlatformWindowData::loop<std::function<void()>&>(PlatformWindowData *this,function<void_()> *step)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long extraout_RDX;
  Size2D *size;
  Size2D *size_00;
  long extraout_RDX_00;
  XEvent *pXVar4;
  char *__format;
  long *plVar5;
  Time TVar6;
  byte bVar7;
  double dVar8;
  XEvent in_stack_fffffffffffffd48;
  Time local_1f0;
  long local_1d8;
  long local_1d0;
  anon_class_8_1_8991fb9c sendExposeEvent;
  XEvent e;
  bool wasResize;
  Window local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  Time local_b8;
  
  bVar7 = 0;
  local_1d8 = std::chrono::_V2::system_clock::now();
  puts("Entering event loop");
  sendExposeEvent.this = this;
  XMoveResizeWindow(this->display,this->handle,(this->last_pos).x,(this->last_pos).y,
                    (this->last_size).w,(this->last_size).h);
  local_1f0 = 0;
  TVar6 = 0;
  lVar3 = extraout_RDX;
  local_1d0 = local_1d8;
  do {
    if (this->eventDriven == false) {
      while (iVar1 = XEventsQueued(this->display), 0 < iVar1) {
        XNextEvent(this->display,&e);
        if (e.type == 0x21) {
          if (e.xany.send_event == 0) {
            printf("[%zi] Not sent CM ",e.xany.serial);
          }
          if (e.xkey.root == this->AWM_PROTOCOLS) {
            if (e.xkey.time == this->AWM_DELETE_WINDOW) {
              this->isQuit = true;
              std::function<void_()>::operator()
                        ((function<void_()> *)(MainWindowDetails::relay + 0x58));
              break;
            }
            __format = "Unknown protocol message %zi\n";
LAB_0011292c:
            printf(__format);
          }
          else {
            if (e.xkey.root != 0x67932) {
              __format = "Other Atom %zi ";
              goto LAB_0011292c;
            }
            local_1f0 = e.xkey.time;
          }
        }
        else {
          _wasResize = _wasResize & 0xffffff00;
          pXVar4 = &e;
          plVar5 = (long *)&stack0xfffffffffffffd48;
          for (lVar3 = 0x18; lVar3 != 0; lVar3 = lVar3 + -1) {
            *plVar5 = pXVar4->pad[0];
            pXVar4 = (XEvent *)((long)pXVar4 + (ulong)bVar7 * -0x10 + 8);
            plVar5 = plVar5 + (ulong)bVar7 * -2 + 1;
          }
          MainWindowDetails::Proc
                    ((Display *)&this->size,(Window *)&wasResize,in_stack_fffffffffffffd48,size_00,
                     (bool *)0x0);
          if (wasResize == true) {
            this->isResizing = true;
            local_1d0 = std::chrono::_V2::system_clock::now();
          }
        }
      }
    }
    else {
      XNextEvent(this->display,&e,lVar3);
      if (((e.type == 0x21) && (e.xkey.root == this->AWM_PROTOCOLS)) &&
         (e.xkey.time == this->AWM_DELETE_WINDOW)) {
        this->isQuit = true;
        std::function<void_()>::operator()((function<void_()> *)(MainWindowDetails::relay + 0x58));
        return;
      }
      pXVar4 = &e;
      plVar5 = (long *)&stack0xfffffffffffffd48;
      for (lVar3 = 0x18; lVar3 != 0; lVar3 = lVar3 + -1) {
        *plVar5 = pXVar4->pad[0];
        pXVar4 = (XEvent *)((long)pXVar4 + (ulong)bVar7 * -0x10 + 8);
        plVar5 = plVar5 + (ulong)bVar7 * -2 + 1;
      }
      MainWindowDetails::Proc
                ((Display *)&this->size,(Window *)&this->isResizing,in_stack_fffffffffffffd48,size,
                 (bool *)0x0);
    }
    this->needRedraw = true;
    lVar2 = std::chrono::_V2::system_clock::now();
    lVar3 = (lVar2 - local_1d0) % 1000;
    if ((double)((lVar2 - local_1d0) / 1000) / 1000.0 <= 300.0) {
      if ((this->needRedraw & 1U) != 0) goto LAB_001129f5;
    }
    else {
      this->needRedraw = true;
      this->isResizing = false;
LAB_001129f5:
      dVar8 = 250.0;
      if (((this->eventDriven | this->isResizing) & 1U) == 0) {
        dVar8 = 1.0;
      }
      lVar2 = std::chrono::_V2::system_clock::now();
      lVar3 = (lVar2 - local_1d8) % 1000;
      if (dVar8 < (double)((lVar2 - local_1d8) / 1000) / 1000.0) {
        if ((this->eventDriven == false) && (TVar6 == local_1f0)) {
          std::function<void_()>::operator()(step);
          loop<std::function<void_()>_&>::anon_class_8_1_8991fb9c::operator()(&sendExposeEvent);
          TVar6 = TVar6 + 1;
          memset(&wasResize,0,0xc0);
          _wasResize = 0x21;
          local_c0 = 0x20;
          local_d0 = this->handle;
          local_c8 = 0x67932;
          local_b8 = TVar6;
          XSendEvent(this->display,local_d0,0,0,&wasResize);
          XSync(this->display);
          lVar3 = extraout_RDX_00;
        }
        this->needRedraw = false;
        local_1d8 = lVar2;
      }
    }
    if (this->isQuit != false) {
      return;
    }
  } while( true );
}

Assistant:

void loop(F&& step)
	{
		auto t0 = std::chrono::high_resolution_clock::now();
		auto t1 = t0, trsz = t0;
		printf("Entering event loop\n");
		long nredraw = 0, nredrawproc = 0;

		auto sendExposeEvent = [&]()
		{
			XExposeEvent xee{};
			xee.type = Expose;
			xee.send_event = True;
			xee.display = display;
			xee.window = handle;
			XSendEvent(display, handle, False, NoEventMask, (XEvent*)&xee);
		};

		//Reposition the window, because some WMs move the window initially despite the x, y, set in create window.
		XMoveResizeWindow(display, handle, last_pos.x, last_pos.y, last_size.w, last_size.h);
		while(true)
		{
			XEvent e;
			if(eventDriven)
			{
				XNextEvent(display, &e);
				if(e.type == ClientMessage && e.xclient.message_type == AWM_PROTOCOLS && (Atom)(e.xclient.data.l[0]) == AWM_DELETE_WINDOW){ isQuit = true; MainWindowDetails::relay.onExit(); break; }
				else{ MainWindowDetails::Proc(display, handle, e, size, isResizing); }
				//step();
				//printf("while 1\n");
				needRedraw = true;
			}
			else
			{
				//auto res = True;
				//while(res == True && !isQuit)
				{
					while(XEventsQueued(display, QueuedAlready) > 0)
					{
						XNextEvent(display, &e);
						if(e.type == ClientMessage)
						{
							if(e.xclient.send_event){ /*printf("[%zi] Sent CM ", e.xclient.serial);*/ }
							else{ printf("[%zi] Not sent CM ", e.xclient.serial); }

							if(e.xclient.message_type == AWM_PROTOCOLS)
							{
								//printf("WM_PROTOCOLS ");
								if( (Atom)(e.xclient.data.l[0]) == AWM_DELETE_WINDOW){ /*printf("AWM_DELETE_WINDOW\n");*/ isQuit = true; MainWindowDetails::relay.onExit(); break; }
								else{ printf("Unknown protocol message %zi\n", e.xclient.data.l[0]); }
							}
							else if(e.xclient.message_type == 424242){ nredrawproc = e.xclient.data.l[0]; /*printf("Redraw processed: %zi\n", nredrawproc);*/ }
							else{ printf("Other Atom %zi ", e.xclient.message_type); }
						}
						else
						{
							bool wasResize = false;
							MainWindowDetails::Proc(display, handle, e, size, wasResize);
							if(wasResize){ isResizing = true; trsz = std::chrono::high_resolution_clock::now(); }
						}
					}
					needRedraw = true;
				}
			}

			if(std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::high_resolution_clock::now()-trsz).count()/1000.0 > 300.0)
			{
				//printf("isResizing = false\n");
				isResizing = false;
				needRedraw = true;
			}

			if(needRedraw)
			{
				double limit = (isResizing || eventDriven) ? 250.0 : 1.0;
				t1 = std::chrono::high_resolution_clock::now();
				auto dt = std::chrono::duration_cast<std::chrono::microseconds>(t1-t0).count()/1000.0;
				if(dt > limit)
				{
					if(eventDriven){ /*printf("limited redraw, expose event, dt = %f\n", dt); sendExposeEvent();*//*XClearArea(display, handle, 0, 0, 1, 1, true);*/ }
					else if(!eventDriven && (nredraw == nredrawproc))
					{
						step();
						sendExposeEvent();//XClearArea(display, handle, 0, 0, 1, 1, true);
						nredraw += 1;
						XEvent ev{0};
						ev.type = ClientMessage;
						ev.xclient.format = 32;
						ev.xclient.window = handle;
						ev.xclient.message_type = 424242;
						ev.xclient.data.l[0] = nredraw;
						XSendEvent(display, handle, False, NoEventMask, &ev);
						XSync(display, False);
						//XFlush(display);
					}
					t0 = t1;
					needRedraw = false;
				}
			}
			//
			//
			if(isQuit){ break; }
		}
	}